

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_SpawnMissile
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar4;
  VMValue *pVVar5;
  AActor *pAVar6;
  PClassActor *pPVar7;
  PClassActor *type;
  char *pcVar8;
  AActor *dest;
  bool bVar9;
  PClass *pPVar3;
  undefined4 extraout_var_00;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_00430638;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00430616:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00430638:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1978,
                  "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar6 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar6 == (AActor *)0x0) goto LAB_0043045a;
    pPVar3 = (pAVar6->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(pAVar6->super_DThinker).super_DObject._vptr_DObject)(pAVar6);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (pAVar6->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar9 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar4 && bVar9) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar9 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar4) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00430638;
    }
  }
  else {
    if (pAVar6 != (AActor *)0x0) goto LAB_00430616;
LAB_0043045a:
    pAVar6 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_00430657;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_0043061f:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00430657;
  }
  dest = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (dest == (AActor *)0x0) goto LAB_0043048d;
LAB_004304a8:
    pPVar3 = AActor::RegistrationInfo.MyClass;
    pPVar4 = (dest->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar2 = (**(dest->super_DThinker).super_DObject._vptr_DObject)(dest);
      pPVar4 = (PClass *)CONCAT44(extraout_var_00,iVar2);
      (dest->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar9 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar3 && bVar9) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar9 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar3) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar8 = "dest == NULL || dest->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_00430657:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1979,
                    "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (dest != (AActor *)0x0) goto LAB_0043061f;
LAB_0043048d:
    NullParam("\"dest\"");
    dest = (AActor *)param[1].field_0.field_1.a;
    if (dest != (AActor *)0x0) goto LAB_004304a8;
    dest = (AActor *)0x0;
  }
  if (numparam < 3) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_00430676;
  }
  if (param[2].field_0.field_3.Type != '\x03') {
LAB_00430628:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00430676:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x197a,
                  "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  type = (PClassActor *)param[2].field_0.field_1.a;
  if (param[2].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_00430583;
    pPVar7 = type;
    if (type != (PClassActor *)AActor::RegistrationInfo.MyClass) {
      do {
        pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
        if (pPVar7 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
      } while (pPVar7 != (PClassActor *)0x0);
      if (pPVar7 == (PClassActor *)0x0) {
        pcVar8 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
        goto LAB_00430676;
      }
    }
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_00430628;
LAB_00430583:
    type = (PClassActor *)0x0;
  }
  if (numparam == 3) {
    pVVar1 = defaultparam->Array;
    if ((pVVar1[3].field_0.field_3.Type == '\x03') &&
       ((pVVar5 = pVVar1 + 3, pVVar1[3].field_0.field_1.atag == 1 ||
        ((pVVar5->field_0).field_1.a == (void *)0x0)))) {
LAB_004305d1:
      pAVar6 = P_SpawnMissile(pAVar6,dest,type,(AActor *)(pVVar5->field_0).field_1.a);
      if (numret < 1) {
        iVar2 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x197c,
                        "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iVar2 = 1;
        VMReturn::SetPointer(ret,pAVar6,1);
      }
      return iVar2;
    }
    pcVar8 = 
    "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
    ;
  }
  else {
    if ((param[3].field_0.field_3.Type == '\x03') &&
       ((pVVar5 = param + 3, param[3].field_0.field_1.atag == 1 ||
        ((pVVar5->field_0).field_1.a == (void *)0x0)))) goto LAB_004305d1;
    pcVar8 = 
    "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
    ;
  }
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x197b,
                "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnMissile)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(dest, AActor);
	PARAM_CLASS(type, AActor);
	PARAM_OBJECT_DEF(owner, AActor);
	ACTION_RETURN_OBJECT(P_SpawnMissile(self, dest, type, owner));
}